

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

int slang::ast::TimingControl::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SourceRange sourceRange;
  undefined4 in_register_0000003c;
  SyntaxNode *this;
  ASTContext *in_stack_00000018;
  SyntaxNode *in_stack_00000020;
  Compilation *in_stack_00000028;
  TimingControl *result;
  Compilation *comp;
  ASTContext ctx;
  TimingControl *in_stack_ffffffffffffff38;
  Compilation *in_stack_ffffffffffffff40;
  ASTContext *in_stack_ffffffffffffff58;
  SourceLocation this_00;
  SourceLocation this_01;
  DiagCode code;
  SyntaxNode *in_stack_ffffffffffffff90;
  undefined1 local_60 [8];
  ASTContext *context;
  SimpleSequenceExprSyntax *syntax;
  Compilation *compilation;
  ASTContext *context_00;
  SignalEventExpressionSyntax *syntax_00;
  Compilation *compilation_00;
  TimingControl *local_8;
  
  this = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  context = *(ASTContext **)__addr;
  syntax = *(SimpleSequenceExprSyntax **)(__addr->sa_data + 6);
  compilation = *(Compilation **)(__addr + 1);
  context_00 = *(ASTContext **)(__addr[1].sa_data + 6);
  syntax_00 = *(SignalEventExpressionSyntax **)(__addr + 2);
  compilation_00 = *(Compilation **)(__addr[2].sa_data + 6);
  this_00 = (SourceLocation)&stack0xffffffffffffffb8;
  this_01 = (SourceLocation)local_60;
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)this_01,AssignmentDisallowed);
  bitmask<slang::ast::ASTFlags>::operator|=
            ((bitmask<slang::ast::ASTFlags> *)this_00,(bitmask<slang::ast::ASTFlags> *)this_01);
  ASTContext::getCompilation((ASTContext *)0x93a755);
  code = (DiagCode)this->kind;
  if (code == (DiagCode)0x152) {
    slang::syntax::SyntaxNode::as<slang::syntax::BinarySequenceExprSyntax>(this);
    local_8 = EventListControl::fromSyntax(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  }
  else if (code == (DiagCode)0x16a) {
    slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedSequenceExprSyntax>(this);
    local_8 = EventListControl::fromSyntax(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  }
  else if (code == (DiagCode)0x1a9) {
    slang::syntax::SyntaxNode::as<slang::syntax::SignalEventExpressionSyntax>(this);
    local_8 = SignalEventControl::fromSyntax(compilation_00,syntax_00,context_00);
  }
  else {
    if (code != (DiagCode)0x1b1) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff90);
      sourceRange.endLoc = this_01;
      sourceRange.startLoc = this_00;
      ASTContext::addDiag(in_stack_ffffffffffffff58,code,sourceRange);
      local_8 = badCtrl(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      goto LAB_0093a8dc;
    }
    slang::syntax::SyntaxNode::as<slang::syntax::SimpleSequenceExprSyntax>(this);
    local_8 = SignalEventControl::fromSyntax(compilation,syntax,context);
  }
  local_8->syntax = this;
LAB_0093a8dc:
  return (int)local_8;
}

Assistant:

TimingControl& TimingControl::bind(const SequenceExprSyntax& syntax, const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    auto& comp = ctx.getCompilation();
    TimingControl* result;
    switch (syntax.kind) {
        case SyntaxKind::SimpleSequenceExpr:
            result = &SignalEventControl::fromSyntax(comp, syntax.as<SimpleSequenceExprSyntax>(),
                                                     ctx);
            break;
        case SyntaxKind::ParenthesizedSequenceExpr:
            result = &EventListControl::fromSyntax(comp,
                                                   syntax.as<ParenthesizedSequenceExprSyntax>(),
                                                   ctx);
            break;
        case SyntaxKind::OrSequenceExpr:
            result = &EventListControl::fromSyntax(comp, syntax.as<BinarySequenceExprSyntax>(),
                                                   ctx);
            break;
        case SyntaxKind::SignalEventExpression:
            result = &SignalEventControl::fromSyntax(comp, syntax.as<SignalEventExpressionSyntax>(),
                                                     ctx);
            break;
        default:
            ctx.addDiag(diag::InvalidSyntaxInEventExpr, syntax.sourceRange());
            return badCtrl(comp, nullptr);
    }

    result->syntax = &syntax;
    return *result;
}